

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O2

int __thiscall Annotations::Load(Annotations *this)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  string sqlfn;
  
  std::__cxx11::string::string((string *)&sqlfn,(string *)this);
  lVar2 = std::__cxx11::string::rfind((char)&sqlfn,0x2e);
  if (lVar2 != -1) {
    sqlfn._M_dataplus._M_p[lVar2] = '_';
  }
  std::__cxx11::string::append((char *)&sqlfn);
  this->sqldb = (sqlite3 *)0x0;
  iVar1 = sqlite3_open(sqlfn._M_dataplus._M_p,&this->sqldb);
  __stream = _stderr;
  if (iVar1 == 0) {
    if (this->debug == true) {
      fwrite("Opened database successfully\n",0x1d,1,_stderr);
    }
    Init(this);
    GenerateList(this);
  }
  else {
    uVar3 = sqlite3_errmsg(this->sqldb);
    fprintf(__stream,"Can\'t open database: %s\n",uVar3);
  }
  std::__cxx11::string::~string((string *)&sqlfn);
  return 0;
}

Assistant:

int Annotations::Load(void) {
	std::string sqlfn                        = filename;
	auto pos                                 = sqlfn.rfind('.');
	if (pos != std::string::npos) sqlfn[pos] = '_';
	sqlfn += ".sqlite3";

	sqldb = nullptr;
	int r = sqlite3_open(sqlfn.c_str(), &sqldb);
	if (r) {
		fprintf(stderr, "Can't open database: %s\n", sqlite3_errmsg(sqldb));
	} else {
		if (debug) fprintf(stderr, "Opened database successfully\n");
		Init();
		GenerateList();
	}
	return 0;
}